

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O2

void do_rstat(CHAR_DATA *ch,char *argument)

{
  short sVar1;
  int iVar2;
  OBJ_DATA *pOVar3;
  long *plVar4;
  TRACK_DATA *pTVar5;
  bool bVar6;
  int iVar7;
  ROOM_INDEX_DATA *room;
  char *pcVar8;
  size_t sVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  EXTRA_DESCR_DATA *pEVar13;
  OBJ_DATA **ppOVar14;
  flag_type *pfVar15;
  uint uVar16;
  CHAR_DATA *pCVar17;
  CHAR_DATA **ppCVar18;
  long lVar19;
  double dVar20;
  char ebuf [500];
  char buf [4608];
  char arg [4608];
  
  one_argument(argument,arg);
  if (arg[0] == '\0') {
    room = ch->in_room;
  }
  else {
    room = find_location(ch,arg);
  }
  if (room == (ROOM_INDEX_DATA *)0x0) {
    pcVar8 = "No such location.\n\r";
  }
  else {
    bVar6 = is_room_owner(ch,room);
    if ((((bVar6) || (ch->in_room == room)) || (bVar6 = room_is_private(room), !bVar6)) ||
       (bVar6 = is_trusted(ch,0x3c), bVar6)) {
      sprintf(buf,"Name: \'%s\'\n\rArea: \'%s\'\n\r",room->name,room->area->name);
      send_to_char(buf,ch);
      sVar1 = room->vnum;
      iVar7 = sect_numlookup((int)room->sector_type);
      pcVar8 = capitalize(sect_table[iVar7].name);
      sprintf(buf,"Vnum: %d  Sector: %s  Healing: %d%%  mana: %d%%\n\r",(ulong)(uint)(int)sVar1,
              pcVar8,(ulong)(uint)(int)room->heal_rate,(ulong)(uint)(int)room->mana_rate);
      send_to_char(buf,ch);
      sprintf(buf,"Description:\n\r%s",room->description);
      send_to_char(buf,ch);
      if (room->extra_descr == (EXTRA_DESCR_DATA *)0x0) {
LAB_002c5f3b:
        send_to_char("Characters:",ch);
        ppCVar18 = &room->people;
        while (pCVar17 = *ppCVar18, pCVar17 != (CHAR_DATA *)0x0) {
          bVar6 = can_see(ch,pCVar17);
          if (bVar6) {
            send_to_char(" ",ch);
            one_argument(pCVar17->name,buf);
            send_to_char(buf,ch);
          }
          ppCVar18 = &pCVar17->next_in_room;
        }
        send_to_char(".\n\rObjects:   ",ch);
        ppOVar14 = &room->contents;
        while (pOVar3 = *ppOVar14, pOVar3 != (OBJ_DATA *)0x0) {
          send_to_char(" ",ch);
          one_argument(pOVar3->name,buf);
          send_to_char(buf,ch);
          ppOVar14 = &pOVar3->next_content;
        }
        send_to_char(".\n\r",ch);
        uVar16 = 0;
        for (lVar19 = 0x38; lVar19 != 0x68; lVar19 = lVar19 + 8) {
          plVar4 = *(long **)((long)room->exit + lVar19 + -0x38);
          if (plVar4 != (long *)0x0) {
            ebuf[0] = '\0';
            for (pfVar15 = exit_flags; pfVar15->name != (char *)0x0; pfVar15 = pfVar15 + 1) {
              uVar11 = plVar4[(long)(int)(pfVar15->bit / 0x20) + 1];
              dVar20 = exp2((double)(pfVar15->bit % 0x20));
              if ((uVar11 & (long)dVar20) != 0) {
                sVar9 = strlen(ebuf);
                (ebuf + sVar9)[0] = ' ';
                (ebuf + sVar9)[1] = '\0';
                strcat(ebuf,pfVar15->name);
              }
            }
            uVar11 = 0xffffffffffffffff;
            if (*plVar4 != 0) {
              uVar11 = (ulong)(uint)(int)*(short *)(*plVar4 + 0x13a);
            }
            pcVar8 = (char *)plVar4[5];
            if (*pcVar8 == '\0') {
              pcVar8 = "(none).\n\r";
            }
            sprintf(buf,
                    "Door: %d.  To: %d.  Key: %d.  Exit flags:%s.\n\rKeyword: \'%s\'.  Description: %s"
                    ,(ulong)uVar16,uVar11,(ulong)(uint)(int)(short)plVar4[3],ebuf,plVar4[4],pcVar8);
            send_to_char(buf,ch);
          }
          uVar16 = uVar16 + 1;
        }
        pCVar17 = ch;
        send_to_char("Characters who have passed through:\n\r",ch);
        iVar7 = 0;
        for (lVar19 = 0; lVar19 != 4; lVar19 = lVar19 + 1) {
          pTVar5 = room->tracks[lVar19];
          if ((pTVar5 != (TRACK_DATA *)0x0) && (pTVar5->prey != (CHAR_DATA *)0x0)) {
            iVar2 = (pTVar5->time).hour;
            uVar16 = time_info.hour - iVar2;
            if (time_info.hour < iVar2) {
              iVar10 = (pTVar5->time).day;
              iVar12 = time_info.day - iVar10;
              if ((time_info.hour - iVar2) + 0x18 == -(uint)(iVar10 <= time_info.day)) {
                iVar2 = (pTVar5->time).month;
                iVar10 = time_info.month - iVar2;
                if (((uint)(iVar2 <= time_info.month) | iVar12 * 0x18) == 0xfffffd30) {
                  uVar16 = (time_info.year - (pTVar5->time).year) * 0x21c0 + iVar10 * 0x2d0 + 0x21c0
                  ;
                }
                else {
                  uVar16 = iVar10 * 0x2d0;
                }
              }
              else {
                uVar16 = iVar12 * 0x18;
              }
            }
            pcVar8 = flag_name_lookup((long)pTVar5->direction,direction_table);
            sprintf(buf,"%s exited to the %s %d hours ago.\n\r",room->tracks[lVar19]->prey->name,
                    pcVar8,(ulong)uVar16);
            pCVar17 = ch;
            send_to_char(buf,ch);
            iVar7 = iVar7 + 1;
          }
        }
        if (iVar7 == 0) {
          pCVar17 = ch;
          send_to_char("None!\n\r",ch);
        }
        do_raffects(ch,(char *)pCVar17);
        return;
      }
      pEVar13 = (EXTRA_DESCR_DATA *)&room->extra_descr;
      pcVar8 = "Extra description keywords: \'";
      do {
        send_to_char(pcVar8,ch);
        do {
          pEVar13 = pEVar13->next;
          if (pEVar13 == (EXTRA_DESCR_DATA *)0x0) {
            send_to_char("\'.\n\r",ch);
            goto LAB_002c5f3b;
          }
          send_to_char(pEVar13->keyword,ch);
          pcVar8 = " ";
        } while (pEVar13->next == (EXTRA_DESCR_DATA *)0x0);
      } while( true );
    }
    pcVar8 = "That room is private right now.\n\r";
  }
  send_to_char(pcVar8,ch);
  return;
}

Assistant:

void do_rstat(CHAR_DATA *ch, char *argument)
{
	char buf[MAX_STRING_LENGTH];
	char arg[MAX_INPUT_LENGTH];
	ROOM_INDEX_DATA *location;
	OBJ_DATA *obj;
	CHAR_DATA *rch;
	char *direction;
	int door = 0, i = 0, counter = 0, time = 0;

	one_argument(argument, arg);

	location = (arg[0] == '\0') ? ch->in_room : find_location(ch, arg);

	if (location == nullptr)
	{
		send_to_char("No such location.\n\r", ch);
		return;
	}

	if (!is_room_owner(ch, location)
		&& ch->in_room != location
		&& room_is_private(location)
		&& !is_trusted(ch, IMPLEMENTOR))
	{
		send_to_char("That room is private right now.\n\r", ch);
		return;
	}

	sprintf(buf, "Name: '%s'\n\rArea: '%s'\n\r", location->name, location->area->name);
	send_to_char(buf, ch);

	sprintf(buf, "Vnum: %d  Sector: %s  Healing: %d%%  mana: %d%%\n\r",
		location->vnum,
		capitalize(sect_table[sect_numlookup(location->sector_type)].name),
		location->heal_rate,
		location->mana_rate);
	send_to_char(buf, ch);

	sprintf(buf, "Description:\n\r%s", location->description);
	send_to_char(buf, ch);

	if (location->extra_descr != nullptr)
	{
		EXTRA_DESCR_DATA *ed;

		send_to_char("Extra description keywords: '", ch);

		for (ed = location->extra_descr; ed; ed = ed->next)
		{
			send_to_char(ed->keyword, ch);
			if (ed->next != nullptr)
				send_to_char(" ", ch);
		}

		send_to_char("'.\n\r", ch);
	}

	send_to_char("Characters:", ch);
	for (rch = location->people; rch; rch = rch->next_in_room)
	{
		if (can_see(ch, rch))
		{
			send_to_char(" ", ch);
			one_argument(rch->name, buf);
			send_to_char(buf, ch);
		}
	}

	send_to_char(".\n\rObjects:   ", ch);

	for (obj = location->contents; obj; obj = obj->next_content)
	{
		send_to_char(" ", ch);
		one_argument(obj->name, buf);
		send_to_char(buf, ch);
	}

	send_to_char(".\n\r", ch);

	for(auto pexit : location->exit)
	{
		char ebuf[500];

		if (pexit != nullptr)
		{
			ebuf[0] = '\0';

			for (i = 0; exit_flags[i].name != nullptr; i++)
			{
				if (IS_SET(pexit->exit_info, exit_flags[i].bit))
				{
					strcat(ebuf, " ");
					strcat(ebuf, exit_flags[i].name);
				}
			}

			sprintf(buf, "Door: %d.  To: %d.  Key: %d.  Exit flags:%s.\n\rKeyword: '%s'.  Description: %s",
				door,
				(pexit->u1.to_room == nullptr ? -1 : pexit->u1.to_room->vnum),
				pexit->key,
				ebuf,
				pexit->keyword,
				pexit->description[0] != '\0' ? pexit->description : "(none).\n\r");
			send_to_char(buf, ch);
		}

		door++;
	}

	send_to_char("Characters who have passed through:\n\r", ch);
	for (i = 0; i < MAX_TRACKS; i++)
	{
		if (location->tracks[i] && location->tracks[i]->prey)
		{
			time = (time_info.hour >= location->tracks[i]->time.hour)
					   ? (time_info.hour - location->tracks[i]->time.hour)
					   : (24 + time_info.hour - location->tracks[i]->time.hour) +
								 (time_info.day >= location->tracks[i]->time.day)
							 ? 24 * (time_info.day - location->tracks[i]->time.day)
							 : 24 * (30 + time_info.day - location->tracks[i]->time.day) +
									   (time_info.month >= location->tracks[i]->time.month)
								   ? 24 * 30 * (time_info.month - location->tracks[i]->time.month)
								   : 24 * 30 * (12 + time_info.month - location->tracks[i]->time.month) +
										 24 * 30 * 12 * (time_info.year - location->tracks[i]->time.year);

			direction = flag_name_lookup(location->tracks[i]->direction, direction_table);

			sprintf(buf, "%s exited to the %s %d hours ago.\n\r", location->tracks[i]->prey->name, direction, time);
			send_to_char(buf, ch);

			counter++;
		}
	}

	if (counter == 0)
		send_to_char("None!\n\r", ch);

	do_raffects(ch, "");
}

void do_ostat(CHAR_DATA *ch, char *argument)
{
	char buf[MAX_STRING_LENGTH], arg[MAX_INPUT_LENGTH], buf2[MSL];
	OBJ_AFFECT_DATA *paf;
	OBJ_APPLY_DATA *app;
	AFFECT_DATA *paf2;
	OBJ_DATA *obj;

	one_argument(argument, arg);

	if (arg[0] == '\0')
	{
		send_to_char("Stat what?\n\r", ch);
		return;
	}

	obj = get_obj_world(ch, argument);

	if (obj == nullptr || (obj && obj->carried_by && !can_see(ch, obj->carried_by)))
	{
		send_to_char("Nothing like that in hell, earth, or heaven.\n\r", ch);
		return;
	}

	sprintf(buf, "Name(s): %s\n\r", obj->name);
	send_to_char(buf, ch);

	sprintf(buf, "Vnum: %d  Format: %s  Type: %s  Resets: %d\n\r",
		obj->pIndexData->vnum,
		obj->pIndexData->new_format ? "new" : "old",
		item_name_lookup(obj->item_type),
		obj->pIndexData->reset_num);
	send_to_char(buf, ch);

	sprintf(buf, "Short description: %s\n\rLong description: %s\n\r", obj->short_descr, obj->description);
	send_to_char(buf, ch);

	sprintf(buf, "Owner: %s\n\r", obj->owner);
	send_to_char(buf, ch);

	sprintf(buf, "Wear bits: %s\n\rExtra bits: %s\n\r",
		wear_bit_name(obj->wear_flags),
		extra_bit_name(obj->extra_flags));
	send_to_char(buf, ch);

	sprintf(buf, "Restrict_flags: %s\n\r", restrict_bit_name(obj->pIndexData->restrict_flags));
	send_to_char(buf, ch);

	sprintf(buf, "Number: %d/%d  Weight: %d/%d/%d pounds  Material: %s  Mat Index: %d\n\r",
		1,
		get_obj_number(obj),
		obj->weight,
		get_obj_weight(obj),
		get_true_weight(obj),
		obj->material,
		obj->pIndexData->material_index);
	send_to_char(buf, ch);

	sprintf(buf, "Level: %d  Cost: %d  Condition: %d  Timer: %d\n\r",
		obj->level,
		obj->cost,
		obj->condition,
		obj->timer);
	send_to_char(buf, ch);

	sprintf(buf, "In room: %d  In object: %s  Carried by: %s  Wear_loc: %d\n\r",
		obj->in_room == nullptr ? 0 : obj->in_room->vnum,
		obj->in_obj == nullptr ? "(none)" : obj->in_obj->short_descr,
		obj->carried_by == nullptr ? "(none)" : can_see(ch, obj->carried_by) ? obj->carried_by->name : "someone",
		obj->wear_loc);
	send_to_char(buf, ch);

	sprintf(buf, "Values: %d %d %d %d %d\n\r",
		obj->value[0],
		obj->value[1],
		obj->value[2],
		obj->value[3],
		obj->value[4]);
	send_to_char(buf, ch);

	/* Report object limit and count and say if maxxed */
	sprintf(buf, "COUNT_DATA: Limit is %d, Count is %d -->%s.\n\r",
		obj->pIndexData->limtotal,
		obj->pIndexData->limcount,
		obj->pIndexData->limcount < obj->pIndexData->limtotal
			? "Not maxxed"
			: obj->pIndexData->limtotal == 0 ? "Non-limited" : "Maxxed");
	send_to_char(buf, ch);

	/* now give out vital statistics as per identify */

	switch (obj->item_type)
	{
		case ITEM_SCROLL:
		case ITEM_POTION:
		case ITEM_PILL:
			sprintf(buf, "Level %d spells of:", obj->value[0]);
			send_to_char(buf, ch);

			if (obj->value[1] >= 0 && obj->value[1] < MAX_SKILL)
			{
				send_to_char(" '", ch);
				send_to_char(skill_table[obj->value[1]].name, ch);
				send_to_char("'", ch);
			}

			if (obj->value[2] >= 0 && obj->value[2] < MAX_SKILL)
			{
				send_to_char(" '", ch);
				send_to_char(skill_table[obj->value[2]].name, ch);
				send_to_char("'", ch);
			}

			if (obj->value[3] >= 0 && obj->value[3] < MAX_SKILL)
			{
				send_to_char(" '", ch);
				send_to_char(skill_table[obj->value[3]].name, ch);
				send_to_char("'", ch);
			}

			if (obj->value[4] >= 0 && obj->value[4] < MAX_SKILL)
			{
				send_to_char(" '", ch);
				send_to_char(skill_table[obj->value[4]].name, ch);
				send_to_char("'", ch);
			}

			send_to_char(".\n\r", ch);
			break;
		case ITEM_WAND:
		case ITEM_STAFF:
			sprintf(buf, "Has %d(%d) charges of level %d", obj->value[1], obj->value[2], obj->value[0]);
			send_to_char(buf, ch);

			if (obj->value[3] >= 0 && obj->value[3] < MAX_SKILL)
			{
				send_to_char(" '", ch);
				send_to_char(skill_table[obj->value[3]].name, ch);
				send_to_char("'", ch);
			}

			send_to_char(".\n\r", ch);
			break;
		case ITEM_DRINK_CON:
			sprintf(buf, "It holds %s-colored %s.\n\r",
				liq_table[obj->value[2]].liq_color,
				liq_table[obj->value[2]].liq_name);
			send_to_char(buf, ch);
			break;
		case ITEM_WEAPON:
			send_to_char("Weapon type is ", ch);

			switch (obj->value[0])
			{
				case WEAPON_EXOTIC:
					send_to_char("exotic\n\r", ch);
					break;
				case WEAPON_SWORD:
					send_to_char("sword\n\r", ch);
					break;
				case WEAPON_DAGGER:
					send_to_char("dagger\n\r", ch);
					break;
				case WEAPON_SPEAR:
					send_to_char("spear\n\r", ch);
					break;
				case WEAPON_MACE:
					send_to_char("mace\n\r", ch);
					break;
				case WEAPON_AXE:
					send_to_char("axe\n\r", ch);
					break;
				case WEAPON_FLAIL:
					send_to_char("flail\n\r", ch);
					break;
				case WEAPON_WHIP:
					send_to_char("whip\n\r", ch);
					break;
				case WEAPON_POLEARM:
					send_to_char("polearm\n\r", ch);
					break;
				case WEAPON_STAFF:
					send_to_char("staff.\n\r", ch);
					break;
				default:
					send_to_char("unknown\n\r", ch);
					break;
			}

			if (obj->pIndexData->new_format)
			{
				sprintf(buf, "Damage is %dd%d (average %d)\n\r",
					obj->value[1],
					obj->value[2],
					(1 + obj->value[2]) * obj->value[1] / 2);
			}
			else
			{
				sprintf(buf, "Damage is %d to %d (average %d)\n\r",
					obj->value[1],
					obj->value[2],
					(obj->value[1] + obj->value[2]) / 2);
			}
			send_to_char(buf, ch);

			sprintf(buf, "Damage noun is %s.\n\r",
				(obj->value[3] > 0 && obj->value[3] < MAX_DAMAGE_MESSAGE)
					? attack_table[obj->value[3]].noun
					: "undefined");
			send_to_char(buf, ch);

			if (obj->value[4]) /* weapon flags */
			{
				sprintf(buf, "Weapons flags: %s\n\r", weapon_bit_name(obj->value[4]));
				send_to_char(buf, ch);
			}
			break;
		case ITEM_ARMOR:
			sprintf(buf, "Armor class is %d pierce, %d bash, %d slash, and %d vs. magic\n\r",
				obj->value[0],
				obj->value[1],
				obj->value[2],
				obj->value[3]);
			send_to_char(buf, ch);
			break;
		case ITEM_CORPSE_NPC:
		case ITEM_CORPSE_PC:
			sprintf(buf, "Original HP: %d  Owner: %s  Killed by: %s\n\r",
				obj->ohp,
				obj->owner,
				obj->talked);
			send_to_char(buf, ch);
			break;
		case ITEM_CONTAINER:
			sprintf(buf, "Capacity: %d#  Maximum weight: %d#  flags: %s\n\r",
				obj->value[0],
				obj->value[3],
				cont_bit_name(obj->value[1]));
			send_to_char(buf, ch);
			break;
	}

	if (obj->pIndexData->notes)
	{
		sprintf(buf, "NOTES: %s\n\r", obj->pIndexData->notes);
		send_to_char(buf, ch);
	}

	if (obj->extra_descr != nullptr || obj->pIndexData->extra_descr != nullptr)
	{
		EXTRA_DESCR_DATA *ed, *ed2;
		bool duplicate = false; /* Don't duplicate extradescs. */

		send_to_char("Extra description keywords: '", ch);

		for (ed = obj->extra_descr; ed != nullptr; ed = ed->next)
		{
			send_to_char(ed->keyword, ch);

			if (ed->next != nullptr)
				send_to_char(" ", ch);
		}

		for (ed = obj->pIndexData->extra_descr; ed != nullptr; ed = ed->next)
		{
			for (ed2 = obj->extra_descr; ed2; ed2 = ed2->next)
			{
				if (!str_cmp(ed->keyword, ed2->keyword))
					duplicate = true;
			}

			if (duplicate)
				continue;

			send_to_char(ed->keyword, ch);

			if (ed->next != nullptr)
				send_to_char(" ", ch);
		}

		send_to_char("'\n\r", ch);
	}

	if (obj->pIndexData->progtypes != 0)
	{
		if (IS_SET(obj->progtypes, IPROG_WEAR))
		{
			sprintf(buf, "Item has wear prog: %s\n\r", obj->pIndexData->iprogs->wear_name);
			send_to_char(buf, ch);
		}

		if (IS_SET(obj->progtypes, IPROG_REMOVE))
		{
			sprintf(buf, "Item has remove prog: %s\n\r", obj->pIndexData->iprogs->remove_name);
			send_to_char(buf, ch);
		}

		if (IS_SET(obj->progtypes, IPROG_GET))
		{
			sprintf(buf, "Item has get prog: %s\n\r", obj->pIndexData->iprogs->get_name);
			send_to_char(buf, ch);
		}

		if (IS_SET(obj->progtypes, IPROG_DROP))
		{
			sprintf(buf, "Item has drop prog: %s\n\r", obj->pIndexData->iprogs->drop_name);
			send_to_char(buf, ch);
		}

		if (IS_SET(obj->progtypes, IPROG_SAC))
		{
			sprintf(buf, "Item has sacrifice prog: %s\n\r", obj->pIndexData->iprogs->sac_name);
			send_to_char(buf, ch);
		}

		if (IS_SET(obj->progtypes, IPROG_GIVE))
		{
			sprintf(buf, "Item has give prog: %s\n\r", obj->pIndexData->iprogs->give_name);
			send_to_char(buf, ch);
		}

		if (IS_SET(obj->progtypes, IPROG_FIGHT))
		{
			sprintf(buf, "Item has fight prog: %s\n\r", obj->pIndexData->iprogs->fight_name);
			send_to_char(buf, ch);
		}

		if (IS_SET(obj->progtypes, IPROG_DEATH))
		{
			sprintf(buf, "Item has death prog: %s\n\r", obj->pIndexData->iprogs->death_name);
			send_to_char(buf, ch);
		}

		if (IS_SET(obj->progtypes, IPROG_SPEECH))
		{
			sprintf(buf, "Item has speech prog: %s\n\r", obj->pIndexData->iprogs->speech_name);
			send_to_char(buf, ch);
		}

		if (IS_SET(obj->progtypes, IPROG_PULSE))
		{
			sprintf(buf, "Item has pulse prog: %s\n\r", obj->pIndexData->iprogs->pulse_name);
			send_to_char(buf, ch);
		}

		if (IS_SET(obj->progtypes, IPROG_ENTRY))
		{
			sprintf(buf, "Item has entry prog: %s\n\r", obj->pIndexData->iprogs->entry_name);
			send_to_char(buf, ch);
		}

		if (IS_SET(obj->progtypes, IPROG_INVOKE))
		{
			sprintf(buf, "Item has invoke prog: %s\n\r", obj->pIndexData->iprogs->invoke_name);
			send_to_char(buf, ch);
		}

		if (IS_SET(obj->progtypes, IPROG_GREET))
		{
			sprintf(buf, "Item has greet prog: %s\n\r", obj->pIndexData->iprogs->greet_name);
			send_to_char(buf, ch);
		}

		if (IS_SET(obj->progtypes, IPROG_VERB))
		{
			sprintf(buf, "Item has verb prog: %s\n\r", obj->pIndexData->iprogs->verb_name);
			send_to_char(buf, ch);
		}
	}

	if (obj->pIndexData->spec_prog.func)
	{
		int i;
		long x;

		for (i = 0; ispec_table[i].spec_name; i++)
		{
			if (ispec_table[i].spec_func == obj->pIndexData->spec_prog.func)
				break;
		}

		if (!ispec_table[i].spec_name)
		{
			RS.Logger.Warn("Error: Invalid ispec.");
			return;
		}

		sprintf(buf, "Item has special prog: %s\n\r", ispec_table[i].spec_name);
		send_to_char(buf, ch);
		send_to_char("Item traps on: ", ch);

		for (x = 1; x < 1073741824; x = x * 2)
		{
			if (ispec_table[i].spec_events & x)
			{
				send_to_char(flag_name_lookup(x, ievent_table), ch);
				send_to_char(" ", ch);
			}
		}

		send_to_char("\n\r", ch);
	}

	if (obj->pIndexData->wear_echo[0] != nullptr)
	{
		sprintf(buf, "Item echos to wearer: %s\n\r", obj->pIndexData->wear_echo[0]);
		send_to_char(buf, ch);
	}

	if (obj->pIndexData->wear_echo[1] != nullptr)
	{
		sprintf(buf, "Item echos to room on wear: %s\n\r", obj->pIndexData->wear_echo[1]);
		send_to_char(buf, ch);
	}

	if (obj->pIndexData->remove_echo[0] != nullptr)
	{
		sprintf(buf, "Item echos to remover: %s\n\r", obj->pIndexData->remove_echo[0]);
		send_to_char(buf, ch);
	}

	if (obj->pIndexData->remove_echo[1] != nullptr)
	{
		sprintf(buf, "Item echos to room on remove: %s\n\r", obj->pIndexData->remove_echo[1]);
		send_to_char(buf, ch);
	}

	if (obj->pIndexData->wear_loc_name != nullptr)
	{
		sprintf(buf, "Item has cosmetic wear location: worn \"%s\"\n\r", obj->pIndexData->wear_loc_name);
		send_to_char(buf, ch);
	}

	for (app = obj->apply; app; app = app->next)
	{
		sprintf(buf, "Modifies %s by %d.\n\r", affect_loc_name(app->location), app->modifier);
		send_to_char(buf, ch);
	}

	if (!IS_ZERO_VECTOR(obj->imm_flags))
	{
		sprintf(buf, "Grants immunity to: %s\n\r", imm_bit_name(obj->imm_flags));
		send_to_char(buf, ch);
	}

	if (!IS_ZERO_VECTOR(obj->res_flags))
	{
		sprintf(buf, "Grants resistance to: %s\n\r", imm_bit_name(obj->res_flags));
		send_to_char(buf, ch);
	}

	if (!IS_ZERO_VECTOR(obj->vuln_flags))
	{
		sprintf(buf, "Afflicts with vulnerability to: %s\n\r", imm_bit_name(obj->vuln_flags));
		send_to_char(buf, ch);
	}

	if (obj->wear_loc_name)
	{
		sprintf(buf, "Item is <worn %s>.\n\r", obj->wear_loc_name);
		send_to_char(buf, ch);
	}

	for (paf2 = obj->charaffs; paf2; paf2 = paf2->next)
	{
		if (paf2->bitvector)
		{
			sprintf(buf, "Imbues wearer with %s.\n\r", affect_bit_name(paf2->bitvector));
			send_to_char(buf, ch);
		}
	}

	for (paf = obj->affected; paf != nullptr; paf = paf->next)
	{
		if (paf->aftype == AFT_SKILL)
			sprintf(buf2, "Skill");
		else if (paf->aftype == AFT_POWER)
			sprintf(buf2, "Power");
		else if (paf->aftype == AFT_COMMUNE)
			sprintf(buf2, "Commune");
		else if (paf->aftype == AFT_RUNE)
			sprintf(buf2, "Rune");
		else
			sprintf(buf2, "Spell");

		auto buffer = fmt::sprintf(buf, "%s: '%s' modifies %s by %d for %d%s hours with %s-bits %s, owner %s, level %d.\n\r",
			buf2,
			skill_table[(int)paf->type].name,
			(paf->where == TO_OBJ_AFFECTS)
				? str_cmp(oaffect_loc_name(paf->location), "none")
					? oaffect_loc_name(paf->location)
					: (paf->where == TO_OBJ_APPLY)
						? affect_loc_name(paf->location)
						: apply_locations[paf->location].name
				: "none",
			paf->modifier,
			(paf->duration == -1) ? -1 : (paf->duration / 2) + 1,
			(paf->duration == 0) ? "" : (paf->duration == -1) ? "" : ".5",
			(paf->where == TO_OBJ_AFFECTS) ? "aff" : (paf->where == TO_OBJ_APPLY) ? "apply" : "?",
			oaffect_bit_name(paf->bitvector),
			(paf->owner) ? paf->owner->name : "none", paf->level);
		send_to_char(buffer.c_str(), ch);
	}
}